

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

ON_wString Internal_VulgarFractionXator(int updown,ON_wString *X)

{
  int iVar1;
  wchar_t *pwVar2;
  int iVar3;
  int iVar4;
  uint code_point;
  ON_Internal_Empty_wString *pOVar5;
  ON_wString *in_RDX;
  bool bVar6;
  undefined4 in_register_0000003c;
  ON_wString *this;
  int iVar7;
  bool bVar8;
  ON__UINT32 cp0;
  ON_wString ator;
  ON_wString local_48;
  ON_UnicodeErrorParameters e;
  
  this = (ON_wString *)CONCAT44(in_register_0000003c,updown);
  if ((int)X != 0) {
    pwVar2 = in_RDX->m_s;
    pOVar5 = &empty_wstring;
    if (pwVar2 != (wchar_t *)0x0) {
      pOVar5 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
    }
    iVar1 = (pOVar5->header).string_length;
    if (((0 < (long)iVar1) && (pwVar2 != (wchar_t *)0x0)) && (0 < (pOVar5->header).string_capacity))
    {
      ON_wString::ON_wString(&ator);
      ON_wString::ReserveArray(&ator,(long)iVar1);
      bVar6 = false;
      for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + iVar3) {
        e.m_error_code_point = ON_UnicodeErrorParameters::MaskErrors.m_error_code_point;
        e.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_status;
        e.m_error_mask = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
        cp0 = 0x110000;
        iVar3 = ON_DecodeWideChar(pwVar2 + iVar7,iVar1 - iVar7,&e,&cp0);
        code_point = 0xfffd;
        if ((0 < iVar3) && (iVar4 = ON_IsValidUnicodeCodePoint(cp0), iVar4 != 0)) {
          if ((int)X < 1) {
            code_point = ON_UnicodeSubcriptFromCodePoint(cp0,cp0);
          }
          else {
            code_point = ON_UnicodeSuperscriptFromCodePoint(cp0,cp0);
          }
        }
        bVar8 = code_point != cp0;
        ON_wString::FromUnicodeCodePoint(&local_48,code_point);
        ON_wString::operator+=(&ator,&local_48);
        ON_wString::~ON_wString(&local_48);
        if (iVar3 < 1) {
          iVar3 = 1;
        }
        bVar6 = (bool)(bVar6 | (code_point != 0xfffd && bVar8));
      }
      if (bVar6) {
        in_RDX = &ator;
      }
      ON_wString::ON_wString(this,in_RDX);
      ON_wString::~ON_wString(&ator);
      return (ON_wString)(wchar_t *)this;
    }
    in_RDX = &ON_wString::EmptyString;
  }
  ON_wString::ON_wString(this,in_RDX);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

static const ON_wString Internal_VulgarFractionXator(int updown, const ON_wString X)
{
  if (0 == updown)
    return X;

  const int len = X.Length();
  if (len <= 0)
    return ON_wString::EmptyString;
  const wchar_t* s0 = X.Array();
  if (nullptr == s0)
    return ON_wString::EmptyString;


  bool bReturnAtor = false;
  ON_wString ator;
  ator.ReserveArray(len);
  ON_UnicodeErrorParameters e;
  int delta = 0;
  for (int i = 0; i < len; i += ((delta > 0) ? delta : 1))
  {
    e = ON_UnicodeErrorParameters::MaskErrors;
    ON__UINT32 cp0 = ON_UnicodeCodePoint::ON_InvalidCodePoint;
    delta = ON_DecodeWideChar(s0 + i, len - i, &e, &cp0);
    ON__UINT32 cp1
      = (delta > 0 && ON_IsValidUnicodeCodePoint(cp0))
      ? (updown > 0 ? ON_UnicodeSuperscriptFromCodePoint(cp0,cp0) : ON_UnicodeSubcriptFromCodePoint(cp0,cp0))
      : ON_UnicodeCodePoint::ON_ReplacementCharacter;
    if (cp1 != cp0 && cp1 != ON_UnicodeCodePoint::ON_ReplacementCharacter)
      bReturnAtor = true;
    ator += ON_wString::FromUnicodeCodePoint(cp1);
  }

  return bReturnAtor ? ator : X;
}